

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v7::detail::report_error(format_func func,int error_code,string_view message)

{
  undefined1 local_230 [8];
  memory_buffer full_message;
  
  full_message.super_buffer<char>._vptr_buffer =
       (_func_int **)&full_message.super_buffer<char>.capacity_;
  full_message.super_buffer<char>.ptr_ = (char *)0x0;
  local_230 = (undefined1  [8])&PTR_grow_002cfc00;
  full_message.super_buffer<char>.size_ = 500;
  (*func)((buffer<char> *)local_230,error_code,message);
  fwrite(full_message.super_buffer<char>._vptr_buffer,(size_t)full_message.super_buffer<char>.ptr_,1
         ,_stderr);
  fputc(10,_stderr);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_230);
  return;
}

Assistant:

FMT_FUNC void report_error(format_func func, int error_code,
                           string_view message) FMT_NOEXCEPT {
  memory_buffer full_message;
  func(full_message, error_code, message);
  // Don't use fwrite_fully because the latter may throw.
  (void)std::fwrite(full_message.data(), full_message.size(), 1, stderr);
  std::fputc('\n', stderr);
}